

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall CEditorImage::AnalyzeTileFlags(CEditorImage *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  void *pvVar4;
  int i;
  long lVar5;
  int iVar6;
  ulong uVar7;
  uchar *block;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  
  block = this->m_aTileFlags;
  if ((this->super_CImageInfo).m_Format == 0) {
    for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
      block[lVar5] = '\x04';
    }
  }
  else {
    mem_zero(block,0x100);
    uVar1 = (this->super_CImageInfo).m_Width;
    uVar2 = (this->super_CImageInfo).m_Height;
    uVar17 = (int)(((uint)((int)uVar1 >> 0x1f) >> 0x1c) + uVar1) >> 4;
    if ((int)(((uint)((int)uVar2 >> 0x1f) >> 0x1c) + uVar2) >> 4 == uVar17) {
      iVar6 = 0;
      uVar7 = 0;
      if (0 < (int)uVar17) {
        uVar7 = (ulong)uVar17;
      }
      pvVar4 = (this->super_CImageInfo).m_pData;
      lVar10 = 0;
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
        lVar10 = (long)(int)lVar10;
        iVar11 = 0;
        for (iVar12 = 0; iVar12 != 0x10; iVar12 = iVar12 + 1) {
          iVar3 = (this->super_CImageInfo).m_Width;
          iVar9 = (iVar6 * iVar3 + iVar11) * 4 + 3;
          bVar14 = true;
          for (iVar13 = 0; lVar8 = uVar7 + 1, iVar16 = iVar9, iVar13 != (int)uVar7;
              iVar13 = iVar13 + 1) {
            do {
              lVar8 = lVar8 + -1;
              if (lVar8 == 0) goto LAB_00185693;
              lVar15 = (long)iVar16;
              iVar16 = iVar16 + iVar3 * 4;
            } while (0xf9 < *(byte *)((long)pvVar4 + lVar15));
            bVar14 = false;
LAB_00185693:
            iVar9 = iVar9 + 4;
          }
          if (bVar14) {
            block[lVar10] = block[lVar10] | 4;
          }
          lVar10 = lVar10 + 1;
          iVar11 = iVar11 + uVar17;
        }
        iVar6 = iVar6 + uVar17;
      }
    }
  }
  return;
}

Assistant:

void CEditorImage::AnalyzeTileFlags()
{
	if(m_Format == CImageInfo::FORMAT_RGB)
	{
		for(int i = 0; i < 256; ++i)
			m_aTileFlags[i] = TILEFLAG_OPAQUE;
	}
	else
	{
		mem_zero(m_aTileFlags, sizeof(m_aTileFlags));

		int tw = m_Width/16; // tilesizes
		int th = m_Height/16;
		if(tw == th)
		{
			unsigned char *pPixelData = (unsigned char *)m_pData;

			int TileID = 0;
			for(int ty = 0; ty < 16; ty++)
				for(int tx = 0; tx < 16; tx++, TileID++)
				{
					bool Opaque = true;
					for(int x = 0; x < tw; x++)
						for(int y = 0; y < th; y++)
						{
							int p = (ty*tw+y)*m_Width + tx*tw+x;
							if(pPixelData[p*4+3] < 250)
							{
								Opaque = false;
								break;
							}
						}

					if(Opaque)
						m_aTileFlags[TileID] |= TILEFLAG_OPAQUE;
				}
		}
	}
}